

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCircle,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcCircle *in;
  
  in = (IfcCircle *)operator_new(0x80);
  *(undefined ***)&in->field_0x68 = &PTR__Object_008f50b0;
  *(undefined8 *)&in->field_0x70 = 0;
  *(char **)&in->field_0x78 = "IfcCircle";
  Assimp::IFC::Schema_2x3::IfcConic::IfcConic((IfcConic *)in,&PTR_construction_vtable_24__0099d7d0);
  *(undefined8 *)&(in->super_IfcConic).field_0x58 = 0;
  (in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCircle_0099d6f0;
  *(undefined ***)&in->field_0x68 = &PTR__IfcCircle_0099d7b8;
  *(undefined ***)
   &(in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcCircle_0099d718;
  *(undefined ***)
   &(in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcCircle_0099d740;
  *(undefined ***)
   &(in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 =
       &PTR__IfcCircle_0099d768;
  *(undefined ***)&(in->super_IfcConic).field_0x50 = &PTR__IfcCircle_0099d790;
  GenericFill<Assimp::IFC::Schema_2x3::IfcCircle>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[0xfffffffffffffffd]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }